

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstparser.cc
# Opt level: O2

string * __thiscall
rst::Parser::ParseDirectiveType_abi_cxx11_(string *__return_storage_ptr__,Parser *this)

{
  char *__last;
  byte bVar1;
  char *__first;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  
  __first = this->ptr_;
  iVar3 = isalnum((int)*__first);
  pcVar2 = __first;
  if (iVar3 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    do {
      do {
        pcVar5 = pcVar2;
        __last = pcVar5 + 1;
        bVar1 = pcVar5[1];
        iVar3 = isalnum((int)(char)bVar1);
        pcVar2 = __last;
      } while (iVar3 != 0);
      uVar4 = bVar1 - 0x2b;
      if ((0x34 < uVar4) || ((0x1000000000800dU >> ((ulong)uVar4 & 0x3f) & 1) == 0)) break;
      iVar3 = isalnum((int)pcVar5[2]);
      pcVar2 = pcVar5 + 2;
    } while (iVar3 != 0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (__last != __first) {
      std::__cxx11::string::assign<char_const*,void>
                ((string *)__return_storage_ptr__,__first,__last);
    }
    this->ptr_ = __last;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string rst::Parser::ParseDirectiveType() {
  const char *s = ptr_;
  if (!std::isalnum(*s))
    return std::string();
  for (;;) {
    ++s;
    if (std::isalnum(*s))
      continue;
    switch (*s) {
    case '-': case '_': case '+': case ':': case '.':
      if (std::isalnum(s[1])) {
        ++s;
        continue;
      }
      // Fall through.
    }
    break;
  }
  std::string type;
  if (s != ptr_)
    type.assign(ptr_, s);
  ptr_ = s;
  return type;
}